

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O3

int secp256k1_der_read_len(size_t *len,uchar **sigp,uchar *sigend)

{
  byte *pbVar1;
  uchar *puVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  byte *pbVar7;
  uchar *sigend_00;
  uint uVar8;
  uint uVar9;
  ulong uVar11;
  bool bVar12;
  ulong uStack_68;
  byte abStack_60 [40];
  ulong uVar10;
  
  if (len != (size_t *)0x0) {
    *len = 0;
    pbVar7 = *sigp;
    uVar8 = 0;
    if (pbVar7 < sigend) {
      pbVar1 = pbVar7 + 1;
      *sigp = pbVar1;
      bVar3 = *pbVar7;
      if ((ulong)bVar3 != 0xff) {
        if ((char)bVar3 < '\0') {
          if (bVar3 != 0x80) {
            uVar9 = bVar3 & 0x7f;
            uVar10 = (ulong)uVar9;
            if (((uVar10 <= (ulong)((long)sigend - (long)pbVar1)) && ((byte)uVar9 < 9)) &&
               (*pbVar1 != 0)) {
              if (uVar10 == 0) {
                uVar11 = 0;
              }
              else {
                pbVar7 = pbVar7 + 2;
                uVar5 = 0;
                uVar11 = 0;
                do {
                  uVar11 = (ulong)pbVar7[-1] | uVar11 << 8;
                  *len = uVar11;
                  *sigp = pbVar7;
                  pbVar7 = pbVar7 + 1;
                  uVar5 = uVar5 + 1;
                } while (uVar10 != uVar5);
                if (((long)sigend - (long)pbVar1) - uVar5 < uVar11) {
                  return 0;
                }
              }
              uVar8 = (uint)(0x7f < uVar11);
            }
          }
        }
        else {
          *len = (ulong)bVar3;
          uVar8 = 1;
        }
      }
    }
    return uVar8;
  }
  secp256k1_der_read_len_cold_1();
  abStack_60[0x10] = 0;
  abStack_60[0x11] = 0;
  abStack_60[0x12] = 0;
  abStack_60[0x13] = 0;
  abStack_60[0x14] = 0;
  abStack_60[0x15] = 0;
  abStack_60[0x16] = 0;
  abStack_60[0x17] = 0;
  abStack_60[0x18] = 0;
  abStack_60[0x19] = 0;
  abStack_60[0x1a] = 0;
  abStack_60[0x1b] = 0;
  abStack_60[0x1c] = 0;
  abStack_60[0x1d] = 0;
  abStack_60[0x1e] = 0;
  abStack_60[0x1f] = 0;
  abStack_60[0] = 0;
  abStack_60[1] = 0;
  abStack_60[2] = 0;
  abStack_60[3] = 0;
  abStack_60[4] = 0;
  abStack_60[5] = 0;
  abStack_60[6] = 0;
  abStack_60[7] = 0;
  abStack_60[8] = 0;
  abStack_60[9] = 0;
  abStack_60[10] = 0;
  abStack_60[0xb] = 0;
  abStack_60[0xc] = 0;
  abStack_60[0xd] = 0;
  abStack_60[0xe] = 0;
  abStack_60[0xf] = 0;
  puVar2 = *sigp;
  if (puVar2 == sigend_00) {
    return 0;
  }
  if (*puVar2 != '\x02') {
    return 0;
  }
  *sigp = puVar2 + 1;
  iVar4 = secp256k1_der_read_len(&uStack_68,sigp,sigend_00);
  if (iVar4 == 0) {
    return 0;
  }
  if (uStack_68 == 0) {
    return 0;
  }
  pbVar7 = *sigp;
  if ((ulong)((long)sigend_00 - (long)pbVar7) < uStack_68) {
    return 0;
  }
  bVar3 = *pbVar7;
  if (uStack_68 == 1 || bVar3 != 0) {
    if (bVar3 == 0xff && uStack_68 != 1) {
      bVar3 = 1;
      if ((char)pbVar7[1] < '\0') {
        return 0;
      }
    }
    else {
      if (bVar3 == 0) goto LAB_0011acb9;
      bVar3 = bVar3 >> 7;
    }
    bVar12 = bVar3 == 0;
  }
  else {
    if (-1 < (char)pbVar7[1]) {
      return 0;
    }
LAB_0011acb9:
    uStack_68 = uStack_68 - 1;
    pbVar7 = pbVar7 + 1;
    *sigp = pbVar7;
    bVar12 = true;
  }
  uVar10 = uStack_68;
  if ((uStack_68 < 0x21) && (bVar12)) {
    if (uStack_68 != 0) {
      memcpy(abStack_60 + (0x20 - uStack_68),pbVar7,uStack_68);
    }
    lVar6 = 0;
    bVar12 = false;
    uVar8 = 0;
    do {
      uVar8 = (uint)abStack_60[lVar6] | uVar8 << 8;
      if (0xc < uVar8) {
        bVar12 = true;
        uVar8 = uVar8 - (uVar8 / 0xd + (uVar8 / 0xd) * 0xc);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x20);
    if (!bVar12) goto LAB_0011ad34;
  }
  uVar8 = 0;
LAB_0011ad34:
  *(uint *)len = uVar8;
  *sigp = pbVar7 + uVar10;
  return 1;
}

Assistant:

static int secp256k1_der_read_len(size_t *len, const unsigned char **sigp, const unsigned char *sigend) {
    size_t lenleft;
    unsigned char b1;
    VERIFY_CHECK(len != NULL);
    *len = 0;
    if (*sigp >= sigend) {
        return 0;
    }
    b1 = *((*sigp)++);
    if (b1 == 0xFF) {
        /* X.690-0207 8.1.3.5.c the value 0xFF shall not be used. */
        return 0;
    }
    if ((b1 & 0x80) == 0) {
        /* X.690-0207 8.1.3.4 short form length octets */
        *len = b1;
        return 1;
    }
    if (b1 == 0x80) {
        /* Indefinite length is not allowed in DER. */
        return 0;
    }
    /* X.690-207 8.1.3.5 long form length octets */
    lenleft = b1 & 0x7F; /* lenleft is at least 1 */
    if (lenleft > (size_t)(sigend - *sigp)) {
        return 0;
    }
    if (**sigp == 0) {
        /* Not the shortest possible length encoding. */
        return 0;
    }
    if (lenleft > sizeof(size_t)) {
        /* The resulting length would exceed the range of a size_t, so
         * certainly longer than the passed array size.
         */
        return 0;
    }
    while (lenleft > 0) {
        *len = (*len << 8) | **sigp;
        (*sigp)++;
        lenleft--;
    }
    if (*len > (size_t)(sigend - *sigp)) {
        /* Result exceeds the length of the passed array. */
        return 0;
    }
    if (*len < 128) {
        /* Not the shortest possible length encoding. */
        return 0;
    }
    return 1;
}